

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_dmc.c
# Opt level: O1

_Bool NES_DMC_np_Read(void *chip,UINT16 adr,UINT8 *val)

{
  undefined2 in_register_00000032;
  
  if (CONCAT22(in_register_00000032,adr) == 0x4015) {
    *val = (*(int *)((long)chip + 0x400fc) != 0) << 3 |
           (*(int *)((long)chip + 0x40080) != 0) << 4 |
           *(char *)((long)chip + 0x40118) << 6 | *(char *)((long)chip + 0x400ac) << 7 | *val |
           (*(int *)((long)chip + 0x400f8) != 0) << 2;
    *(undefined1 *)((long)chip + 0x40118) = 0;
  }
  else {
    if (0xc < (ushort)(adr + 0xbff8)) {
      return false;
    }
    *val = *val | *(byte *)((long)chip +
                           (ulong)(CONCAT22(in_register_00000032,adr) - 0x4008) + 0x4004c);
  }
  return true;
}

Assistant:

bool NES_DMC_np_Read(void* chip, UINT16 adr, UINT8* val)
{
	NES_DMC* dmc = (NES_DMC*)chip;

	if (adr == 0x4015)
	{
		*val |=(dmc->irq               ? 0x80 : 0)
			 | (dmc->frame_irq         ? 0x40 : 0)
			 | ((dmc->dlength>0)       ? 0x10 : 0)
			 | (dmc->length_counter[1] ? 0x08 : 0)
			 | (dmc->length_counter[0] ? 0x04 : 0)
			 ;

		dmc->frame_irq = false;
		//cpu->UpdateIRQ(NES_CPU::IRQD_FRAME, false);
		return true;
	}
	else if (0x4008<=adr&&adr<=0x4014)
	{
		*val |= dmc->reg[adr-0x4008];
		return true;
	}
	else
		return false;
}